

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void crec_fill(jit_State *J,TRef trdst,TRef trlen,TRef trfill,CTSize step)

{
  uint uVar1;
  IRRef1 IVar2;
  IROpT IVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int32_t k;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  CRecMemList ml [16];
  uint local_138 [66];
  TRef TVar3;
  
  if (-1 < (short)trlen) {
    uVar1 = (J->cur).ir[trlen & 0x7fff].field_1.op12;
    if (uVar1 == 0) {
      iVar5 = 1;
    }
    else {
      iVar5 = 2;
      if (uVar1 < 0x81) {
        uVar6 = 0x16;
        uVar7 = 0;
        uVar8 = 8;
        uVar12 = 0;
        do {
          if (uVar7 + uVar8 <= uVar1) {
            uVar13 = uVar12;
            if ((uint)uVar12 < 0x11) {
              uVar13 = 0x10;
            }
            puVar9 = local_138 + uVar12 * 4 + 1;
            lVar10 = 0;
            do {
              if (uVar12 - uVar13 == lVar10) {
                uVar11 = 0;
                goto LAB_0015d99c;
              }
              puVar9[-1] = uVar7;
              *puVar9 = uVar6;
              lVar10 = lVar10 + -1;
              puVar9 = puVar9 + 4;
              uVar7 = uVar7 + uVar8;
            } while (uVar8 + uVar7 <= uVar1);
            uVar12 = (ulong)((uint)uVar12 - (int)lVar10);
          }
          uVar11 = (uint)uVar12;
          uVar8 = uVar8 >> 1;
          uVar6 = uVar6 - 2;
        } while (uVar7 < uVar1);
LAB_0015d99c:
        if (uVar11 == 0) {
          iVar5 = 2;
        }
        else {
          if (local_138[1] != 0x10 || -1 < (short)(IRRef1)trfill) {
            (J->fold).ins.field_0.op1 = (IRRef1)trfill;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b130270;
            trfill = lj_opt_fold(J);
          }
          if (local_138[1] != 0x10) {
            if (local_138[1] == 0x16) {
              if (-1 < (short)(IRRef1)trfill) {
                (J->fold).ins.field_0.op1 = (IRRef1)trfill;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b1602d4;
                trfill = lj_opt_fold(J);
              }
              TVar3 = lj_ir_kint64(J,0x101010101010101);
              IVar2 = (IRRef1)TVar3;
              IVar4 = 0x2b16;
            }
            else {
              k = 0x1010101;
              if (local_138[1] == 0x12) {
                k = 0x101;
              }
              TVar3 = lj_ir_kint(J,k);
              IVar2 = (IRRef1)TVar3;
              IVar4 = 0x2b13;
            }
            (J->fold).ins.field_0.ot = IVar4;
            (J->fold).ins.field_0.op1 = (IRRef1)trfill;
            (J->fold).ins.field_0.op2 = IVar2;
            trfill = lj_opt_fold(J);
          }
          lVar10 = 0;
          do {
            TVar3 = lj_ir_kint64(J,(ulong)*(uint *)((long)local_138 + lVar10));
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = (IRRef1)trdst;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
            TVar3 = lj_opt_fold(J);
            (J->fold).ins.field_0.ot =
                 (ushort)*(undefined4 *)((long)local_138 + lVar10 + 4) | 0x4e00;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = (IRRef1)trfill;
            lj_opt_fold(J);
            lVar10 = lVar10 + 0x10;
          } while ((ulong)uVar11 << 4 != lVar10);
          iVar5 = 0;
        }
      }
    }
    if (iVar5 == 0) goto LAB_0015db0b;
    if (iVar5 == 1) {
      return;
    }
  }
  lj_ir_call(J,IRCALL_memset,(ulong)trdst,(ulong)trfill,(ulong)trlen);
LAB_0015db0b:
  (J->fold).ins.field_0.ot = 0x5a00;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_fill(jit_State *J, TRef trdst, TRef trlen, TRef trfill,
		      CTSize step)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_FILL_MAXUNROLL];
    MSize mlp;
    CTSize len = (CTSize)IR(tref_ref(trlen))->i;
    if (len == 0) return;  /* Shortcut. */
    if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
      step = CTSIZE_PTR;
    if (step * CREC_FILL_MAXUNROLL < len) goto fallback;
    mlp = crec_fill_unroll(ml, len, step);
    if (!mlp) goto fallback;
    if (tref_isk(trfill) || ml[0].tp != IRT_U8)
      trfill = emitconv(trfill, IRT_INT, IRT_U8, 0);
    if (ml[0].tp != IRT_U8) {  /* Scatter U8 to U16/U32/U64. */
      if (CTSIZE_PTR == 8 && ml[0].tp == IRT_U64) {
	if (tref_isk(trfill))  /* Pointless on x64 with zero-extended regs. */
	  trfill = emitconv(trfill, IRT_U64, IRT_U32, 0);
	trfill = emitir(IRT(IR_MUL, IRT_U64), trfill,
			lj_ir_kint64(J, U64x(01010101,01010101)));
      } else {
	trfill = emitir(IRTI(IR_MUL), trfill,
		   lj_ir_kint(J, ml[0].tp == IRT_U16 ? 0x0101 : 0x01010101));
      }
    }
    crec_fill_emit(J, ml, mlp, trdst, trfill);
  } else {
fallback:
    /* Call memset. Always needs a barrier to disable alias analysis. */
    lj_ir_call(J, IRCALL_memset, trdst, trfill, trlen);  /* Note: arg order! */
  }
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}